

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityType.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::EntityType::ReadFromTokenisedString
          (EntityType *this,KString *String,KString *Seperator)

{
  pointer pcVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  unsigned_short uVar5;
  int iVar6;
  char *__nptr;
  unsigned_short *puVar7;
  KException *this_00;
  pointer puVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vValues;
  KString sCopy;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_88;
  KString local_70;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar1 = (String->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + String->_M_string_length);
  local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_short *)0x0;
  local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_short *)0x0;
  __nptr = strtok((char *)local_50[0],(Seperator->_M_dataplus)._M_p);
  if (__nptr == (char *)0x0) {
    puVar7 = (unsigned_short *)0x0;
    puVar8 = (pointer)0x0;
  }
  else {
    do {
      iVar6 = atoi(__nptr);
      uVar5 = (unsigned_short)iVar6;
      if (iVar6 < 1) {
        uVar5 = 0;
      }
      local_70._M_dataplus._M_p._0_2_ = uVar5;
      if (local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_short *)&local_70);
      }
      else {
        *local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar5;
        local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      __nptr = strtok((char *)0x0,(Seperator->_M_dataplus)._M_p);
      puVar7 = local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar8 = local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (__nptr != (char *)0x0);
  }
  if ((long)puVar7 - (long)puVar8 != 0xe) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"ReadFromTokenisedString","");
    KException::KException<char_const*>
              (this_00,&local_70,8,"Token String Must Contain 7 Integer Values Only.");
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  this->m_ui8EntityKind = (KUINT8)*puVar8;
  this->m_ui8Domain = (KUINT8)puVar8[1];
  this->m_ui16Country = puVar8[2];
  uVar2 = puVar8[4];
  uVar3 = puVar8[5];
  uVar4 = puVar8[6];
  uVar9 = puVar8[3] & 0xff;
  uVar10 = uVar2 & 0xff;
  uVar11 = uVar3 & 0xff;
  uVar12 = uVar4 & 0xff;
  this->m_ui8Category = (uVar9 != 0) * (uVar9 < 0x100) * (char)puVar8[3] - (0xff < uVar9);
  this->m_ui8SubCategory = (uVar10 != 0) * (uVar10 < 0x100) * (char)uVar2 - (0xff < uVar10);
  this->m_ui8Specific = (uVar11 != 0) * (uVar11 < 0x100) * (char)uVar3 - (0xff < uVar11);
  this->m_ui8Extra = (uVar12 != 0) * (uVar12 < 0x100) * (char)uVar4 - (0xff < uVar12);
  operator_delete(puVar8,(long)local_88.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar8);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void EntityType::ReadFromTokenisedString(const KString &String, const KString &Seperator /*= ","*/ ) noexcept(false)
{
    // Copy the string, we don't want to change the string we have been passed.
    KString sCopy = String;

    vector<KUINT16> vValues;

    KCHAR8 * token = strtok( ( KCHAR8 * )sCopy.c_str(), Seperator.c_str() );

    while (token != nullptr)
    {
        auto i = atoi(token);
        if( i < 0 ) i = 0; // If the value is less than 0 then we need to make it 0.

        vValues.push_back(static_cast<unsigned short>(i));

        // Get next token:
        token = strtok(nullptr, Seperator.c_str());
    }

    // We need 7 values in total, if not we have a problem.
    if( vValues.size() != 7 )
    {
        throw KException( __FUNCTION__, INVALID_DATA, "Token String Must Contain 7 Integer Values Only." );
    }

    // Set the new type.
    m_ui8EntityKind = vValues[0];
    m_ui8Domain = vValues[1];
    m_ui16Country = vValues[2];
    m_ui8Category = vValues[3];
    m_ui8SubCategory = vValues[4];
    m_ui8Specific = vValues[5];
    m_ui8Extra = vValues[6];
}